

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O3

void Omega_h::add_implied_isos_tag(Mesh *mesh)

{
  size_type *psVar1;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  Alloc *pAVar9;
  ScopedTimer omega_h_scoped_function_timer;
  Reals metrics;
  string __str;
  ScopedTimer local_b9;
  string local_b8;
  Alloc *local_98;
  Alloc *local_90;
  undefined1 local_88 [48];
  Reals local_58;
  Alloc *local_48 [2];
  long local_38;
  
  local_48[0] = (Alloc *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric_input.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_48);
  pAVar9 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar9) {
    local_88._0_8_ = pAVar9->size;
    local_88._8_8_ = plVar6[3];
    local_98 = (Alloc *)local_88;
  }
  else {
    local_88._0_8_ = pAVar9->size;
    local_98 = (Alloc *)*plVar6;
  }
  local_90 = (Alloc *)plVar6[1];
  *plVar6 = (long)pAVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar4 = local_88 + 0x20;
  local_88._16_8_ = pcVar4;
  std::__cxx11::string::_M_construct((ulong)(local_88 + 0x10),'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88._16_8_,3,0x115);
  uVar3 = (long)&local_90->size + local_88._24_8_;
  uVar8 = 0xf;
  if (local_98 != (Alloc *)local_88) {
    uVar8 = local_88._0_8_;
  }
  if (uVar8 < uVar3) {
    uVar8 = 0xf;
    if ((char *)local_88._16_8_ != pcVar4) {
      uVar8 = local_88._32_8_;
    }
    if (uVar3 <= uVar8) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)(local_88 + 0x10),0,(char *)0x0,(ulong)local_98)
      ;
      goto LAB_0036a251;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,local_88._16_8_);
LAB_0036a251:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar1;
    local_b8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_b8._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("add_implied_isos_tag",local_b8._M_dataplus._M_p);
  paVar5 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar5) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_88._16_8_ != pcVar4) {
    operator_delete((void *)local_88._16_8_,local_88._32_8_ + 1);
  }
  if (local_98 != (Alloc *)local_88) {
    operator_delete(local_98,local_88._0_8_ + 1);
  }
  if (local_48[0] != (Alloc *)&stack0xffffffffffffffc8) {
    operator_delete(local_48[0],local_38 + 1);
  }
  get_implied_isos((Omega_h *)&local_98,mesh);
  local_58.write_.shared_alloc_.alloc = local_98;
  pAVar9 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc = (Alloc *)(local_98->size * 8 + 1);
      pAVar9 = local_58.write_.shared_alloc_.alloc;
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = local_90;
  local_b8._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"metric","");
  add_metric_tag(mesh,&local_58,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar5) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
    piVar2 = &pAVar9->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar9);
      operator_delete(pAVar9,0x48);
    }
  }
  pAVar9 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    piVar2 = &local_98->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_98);
      operator_delete(pAVar9,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_b9);
  return;
}

Assistant:

void add_implied_isos_tag(Mesh* mesh) {
  OMEGA_H_TIME_FUNCTION;
  auto metrics = get_implied_isos(mesh);
  add_metric_tag(mesh, metrics, "metric");
}